

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_seq.c
# Opt level: O3

jas_seq2d_t * jas_seq2d_copy(jas_seq2d_t *x)

{
  jas_seqent_t *pjVar1;
  jas_seqent_t *pjVar2;
  jas_matrix_t *pjVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  pjVar3 = jas_seq2d_create(x->xstart_,x->ystart_,x->xend_,x->yend_);
  if (pjVar3 != (jas_matrix_t *)0x0) {
    lVar6 = x->numrows_;
    if (0 < lVar6) {
      lVar5 = x->numcols_;
      lVar4 = 0;
      do {
        if (0 < lVar5) {
          pjVar1 = x->rows_[lVar4];
          pjVar2 = pjVar3->rows_[lVar4];
          lVar6 = 0;
          do {
            pjVar2[lVar6] = pjVar1[lVar6];
            lVar6 = lVar6 + 1;
            lVar5 = x->numcols_;
          } while (lVar6 < lVar5);
          lVar6 = x->numrows_;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < lVar6);
    }
    return pjVar3;
  }
  __assert_fail("y",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_seq.c"
                ,0xb1,"jas_seq2d_t *jas_seq2d_copy(jas_seq2d_t *)");
}

Assistant:

jas_seq2d_t *jas_seq2d_copy(jas_seq2d_t *x)
{
	jas_matrix_t *y;
	jas_matind_t i;
	jas_matind_t j;
	y = jas_seq2d_create(jas_seq2d_xstart(x), jas_seq2d_ystart(x),
	  jas_seq2d_xend(x), jas_seq2d_yend(x));
	assert(y);
	for (i = 0; i < x->numrows_; ++i) {
		for (j = 0; j < x->numcols_; ++j) {
			*jas_matrix_getref(y, i, j) = jas_matrix_get(x, i, j);
		}
	}
	return y;
}